

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseLast(ExtensionSet *this,int number)

{
  CppType CVar1;
  Extension *pEVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  LogMessage aLStack_18 [16];
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aLStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x388,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::operator<<
              (aLStack_18,(char (*) [38])"Index out-of-bounds (field is empty).");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)aLStack_18);
  }
  if (pEVar2->is_repeated == false) {
    pcVar6 = "extension->is_repeated";
    uVar4 = 0x16;
    uVar5 = 0x389;
  }
  else {
    CVar1 = anon_unknown_58::cpp_type(pEVar2->type);
    if (CVar1 == CPPTYPE_MESSAGE) {
      pVVar3 = RepeatedPtrFieldBase::
               ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                         ((RepeatedPtrFieldBase *)pEVar2->field_0);
      return pVVar3;
    }
    pcVar6 = "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE";
    uVar4 = 0x3c;
    uVar5 = 0x38a;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
             ,uVar5,uVar4,pcVar6);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)aLStack_18)
  ;
}

Assistant:

ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) {
  const auto* const_this = this;
  return const_cast<ExtensionSet::Extension*>(const_this->FindOrNull(key));
}